

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

ON_ClippingRegionPoints * __thiscall
ON_ClippingRegionPoints::operator=(ON_ClippingRegionPoints *this,ON_ClippingRegionPoints *src)

{
  uint uVar1;
  uint *puVar2;
  ON_3dPoint *pOVar3;
  ON_3dPoint *p1;
  ON_3dPoint *p;
  ON_3dPoint *src_p;
  uint *f1;
  uint *f;
  uint *src_f;
  ON_ClippingRegionPoints *src_local;
  ON_ClippingRegionPoints *this_local;
  
  if ((((this != src) && (Clear(this), src->m_point_count != 0)) &&
      (src->m_clip_points != (ON_3dPoint *)0x0)) && (src->m_clip_flags != (uint *)0x0)) {
    ReserveBufferPointCapacity(this,(ulong)src->m_point_count);
    puVar2 = this->m_clip_flags;
    uVar1 = src->m_point_count;
    f1 = puVar2;
    f = src->m_clip_flags;
    while (f1 < puVar2 + uVar1) {
      *f1 = *f;
      f1 = f1 + 1;
      f = f + 1;
    }
    pOVar3 = this->m_clip_points;
    uVar1 = src->m_point_count;
    p1 = pOVar3;
    p = src->m_clip_points;
    while (p1 < pOVar3 + uVar1) {
      p1->x = p->x;
      p1->y = p->y;
      p1->z = p->z;
      p1 = p1 + 1;
      p = p + 1;
    }
    this->m_point_count = src->m_point_count;
    this->m_point_capacity = src->m_point_capacity;
    this->m_clip_points = src->m_clip_points;
    this->m_clip_flags = src->m_clip_flags;
    this->m_and_clip_flags = src->m_and_clip_flags;
    this->m_or_clip_flags = src->m_or_clip_flags;
  }
  return this;
}

Assistant:

ON_ClippingRegionPoints& ON_ClippingRegionPoints::operator=(const ON_ClippingRegionPoints& src)
{
  if (this != &src)
  {
    Clear();
    if (src.m_point_count > 0 && nullptr != src.m_clip_points && nullptr != src.m_clip_flags)
    {
      ReserveBufferPointCapacity(src.m_point_count);

      const unsigned int* src_f = src.m_clip_flags;
      unsigned int* f = m_clip_flags;
      unsigned int* f1 = f + src.m_point_count;
      while (f < f1 )
        *f++ = *src_f++;

      const ON_3dPoint* src_p = src.m_clip_points;
      ON_3dPoint* p = m_clip_points;
      ON_3dPoint* p1 = p + src.m_point_count;
      while (p < p1)
        *p++ = *src_p++;

      m_point_count = src.m_point_count;
      m_point_capacity = src.m_point_capacity;
      m_clip_points = src.m_clip_points;
      m_clip_flags = src.m_clip_flags;
      m_and_clip_flags = src.m_and_clip_flags;
      m_or_clip_flags = src.m_or_clip_flags;
    }
  }
  return *this;
}